

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTupleMake
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          TupleMake *curr)

{
  Literal *other;
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 local_80 [8];
  value_type arg;
  Literals arguments;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  arg.type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  generateArguments(__return_storage_ptr__,this,&curr->operands,(Literals *)&arg.type);
  if (((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) &&
     (lVar3 = ((long)((long)arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
              ) * -0x5555555555555555 + arg.type.id, lVar3 != 0)) {
    lVar1 = -0x18;
    lVar2 = 0;
    do {
      other = (Literal *)
              (arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id + lVar1);
      if (lVar2 == 0) {
        other = (Literal *)&arguments;
      }
      Literal::Literal((Literal *)local_80,other);
      if (arg.field_0.func.super_IString.str._M_str < (char *)0x2) {
        __assert_fail("arg.type.isConcrete()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x5c6,
                      "Flow wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTupleMake(TupleMake *) [SubType = wasm::PrecomputingExpressionRunner]"
                     );
      }
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,(Literal *)local_80);
      Literal::~Literal((Literal *)local_80);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar3 != lVar2);
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&arguments);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTupleMake(TupleMake* curr) {
    NOTE_ENTER("tuple.make");
    Literals arguments;
    Flow flow = generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    for (auto arg : arguments) {
      assert(arg.type.isConcrete());
      flow.values.push_back(arg);
    }
    return flow;
  }